

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseCacheCoverage::SplitString
          (cmParseCacheCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *line)

{
  string local_a8 [48];
  string local_78 [32];
  undefined1 local_58 [8];
  string arg;
  size_type pos2;
  size_type pos1;
  string *line_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmParseCacheCoverage *this_local;
  
  arg.field_2._8_8_ = std::__cxx11::string::find((char)line,0x2c);
  if (arg.field_2._8_8_ == -1) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string((string *)local_58);
    while (arg.field_2._8_8_ != -1) {
      std::__cxx11::string::substr((ulong)local_78,(ulong)line);
      std::__cxx11::string::operator=((string *)local_58,local_78);
      std::__cxx11::string::~string(local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(args,(value_type *)local_58);
      arg.field_2._8_8_ = std::__cxx11::string::find((char)line,0x2c);
    }
    std::__cxx11::string::substr((ulong)local_a8,(ulong)line);
    std::__cxx11::string::operator=((string *)local_58,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,(value_type *)local_58);
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_58);
  }
  return this_local._7_1_;
}

Assistant:

bool cmParseCacheCoverage::SplitString(std::vector<std::string>& args,
                                       std::string const& line)
{
  std::string::size_type pos1 = 0;
  std::string::size_type pos2 = line.find(',', 0);
  if (pos2 == std::string::npos) {
    return false;
  }
  std::string arg;
  while (pos2 != std::string::npos) {
    arg = line.substr(pos1, pos2 - pos1);
    args.push_back(arg);
    pos1 = pos2 + 1;
    pos2 = line.find(',', pos1);
  }
  arg = line.substr(pos1);
  args.push_back(arg);
  return true;
}